

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::move(Tree *this,size_t node,size_t new_parent,size_t after)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  bool bVar8;
  char msg [29];
  char local_138 [31];
  uint uStack_119;
  undefined1 uStack_115;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  char *pcStack_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  char *pcStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(local_138 + 0x10,"ode != NONE)",0xd);
    builtin_strncpy(local_138,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_48 = 0;
    uStack_40 = 0x653d;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x653d) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x653d) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_138,0x1d,LVar2,(this->m_callbacks).m_user_data);
  }
  if (node == after) {
    builtin_strncpy(local_138 + 0x10,"ode != after)",0xe);
    builtin_strncpy(local_138,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_70 = 0;
    uStack_68 = 0x653e;
    local_60 = 0;
    pcStack_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x653e) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x653e) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_138,0x1e,LVar3,(this->m_callbacks).m_user_data);
  }
  if (new_parent == 0xffffffffffffffff) {
    builtin_strncpy(local_138 + 0x10,"ew_parent != NO",0xf);
    builtin_strncpy(local_138,"check failed: (n",0x10);
    uStack_119 = 0x29454e;
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_98 = 0;
    uStack_90 = 0x653f;
    local_88 = 0;
    pcStack_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_78 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x653f) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x653f) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_138,0x23,LVar4,(this->m_callbacks).m_user_data);
  }
  if (new_parent == node) {
    builtin_strncpy(local_138 + 0x10,"ew_parent != no",0xf);
    builtin_strncpy(local_138,"check failed: (n",0x10);
    uStack_119 = 0x296564;
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_c0 = 0;
    uStack_b8 = 0x6540;
    local_b0 = 0;
    pcStack_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_a0 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6540) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x6540) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_138,0x23,LVar5,(this->m_callbacks).m_user_data);
  }
  if (new_parent == after) {
    builtin_strncpy(local_138 + 0x10,"ew_parent != af",0xf);
    builtin_strncpy(local_138,"check failed: (n",0x10);
    uStack_119 = 0x29726574;
    uStack_115 = 0;
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_e8 = 0;
    uStack_e0 = 0x6541;
    local_d8 = 0;
    pcStack_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_c8 = 0x65;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6541) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x6541) << 0x40,8);
    LVar6.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar6.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_138,0x24,LVar6,(this->m_callbacks).m_user_data);
  }
  bVar8 = is_root(this,node);
  if (bVar8) {
    builtin_strncpy(local_138 + 0x10," is_root(node))",0xf);
    uStack_119 = uStack_119 & 0xffffff00;
    builtin_strncpy(local_138,"check failed: (!",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    local_110 = 0;
    uStack_108 = 0x6542;
    local_100 = 0;
    pcStack_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_f0 = 0x65;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6542) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x6542) << 0x40,8);
    LVar7.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar7.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_138,0x20,LVar7,(this->m_callbacks).m_user_data);
  }
  _rem_hierarchy(this,node);
  _set_hierarchy(this,node,new_parent,after);
  return;
}

Assistant:

void Tree::move(size_t node, size_t new_parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, node != after);
    _RYML_CB_ASSERT(m_callbacks, new_parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, new_parent != node);
    _RYML_CB_ASSERT(m_callbacks, new_parent != after);
    _RYML_CB_ASSERT(m_callbacks,  ! is_root(node));

    _rem_hierarchy(node);
    _set_hierarchy(node, new_parent, after);
}